

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

void mg_if_recv_udp_cb(mg_connection *nc,void *buf,int len,socket_address *sa,size_t sa_len)

{
  mg_connection *mgr;
  undefined8 uVar1;
  void *pvVar2;
  mg_add_sock_opts opts_00;
  int iVar3;
  ulong uVar4;
  mg_connection *c;
  mg_add_sock_opts opts;
  
  uVar4 = nc->flags;
  if ((uVar4 & 2) == 0) {
    __assert_fail("nc->flags & MG_F_UDP",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CryptXor[P]jetservd/mongoose.c"
                  ,0xa33,
                  "void mg_if_recv_udp_cb(struct mg_connection *, void *, int, union socket_address *, size_t)"
                 );
  }
  if (LL_DEBUG < s_cs_log_level) {
    fprintf(_stderr,"%-20s ","mg_if_recv_udp_cb");
    cs_log_printf("%p %u",nc,(ulong)(uint)len);
    uVar4 = nc->flags;
  }
  c = nc;
  if ((uVar4 & 1) != 0) {
    mgr = (mg_connection *)nc->mgr;
    c = mgr;
    do {
      c = c->next;
      if (c == (mg_connection *)0x0) {
        opts_00.error_string = (char **)0x0;
        opts_00.user_data = (void *)0x0;
        opts_00.flags = 0;
        opts_00._12_4_ = 0;
        c = mg_create_connection((mg_mgr *)mgr,nc->handler,opts_00);
        if (c == (mg_connection *)0x0) {
          if (LL_DEBUG < s_cs_log_level) {
            mg_if_recv_udp_cb_cold_1();
          }
          free(buf);
          return;
        }
        break;
      }
      iVar3 = bcmp(&c->sa,sa,sa_len);
    } while (iVar3 != 0);
    c->sock = nc->sock;
    c->listener = nc;
    uVar1 = *(undefined8 *)((sa->sa).sa_data + 6);
    *(undefined8 *)&c->sa = *(undefined8 *)sa;
    *(undefined8 *)((long)&c->sa + 8) = uVar1;
    pvVar2 = nc->proto_data;
    c->proto_handler = nc->proto_handler;
    c->proto_data = pvVar2;
    c->user_data = nc->user_data;
    c->recv_mbuf_limit = nc->recv_mbuf_limit;
    c->flags = 2;
    mg_add_conn(nc->mgr,c);
    mg_call(c,(mg_event_handler_t)0x0,1,&c->sa);
  }
  mg_recv_common(c,buf,len);
  return;
}

Assistant:

void mg_if_recv_udp_cb(struct mg_connection *nc, void *buf, int len,
                       union socket_address *sa, size_t sa_len) {
    assert(nc->flags & MG_F_UDP);
    DBG(("%p %u", nc, (unsigned int) len));
    if (nc->flags & MG_F_LISTENING) {
        struct mg_connection *lc = nc;
        /*
     * Do we have an existing connection for this source?
     * This is very inefficient for long connection lists.
     */
        for (nc = mg_next(lc->mgr, NULL); nc != NULL; nc = mg_next(lc->mgr, nc)) {
            if (memcmp(&nc->sa.sa, &sa->sa, sa_len) == 0) break;
        }
        if (nc == NULL) {
            struct mg_add_sock_opts opts;
            memset(&opts, 0, sizeof(opts));
            nc = mg_create_connection(lc->mgr, lc->handler, opts);
        }
        if (nc != NULL) {
            nc->sock = lc->sock;
            nc->listener = lc;
            nc->sa = *sa;
            nc->proto_data = lc->proto_data;
            nc->proto_handler = lc->proto_handler;
            nc->user_data = lc->user_data;
            nc->recv_mbuf_limit = lc->recv_mbuf_limit;
            nc->flags = MG_F_UDP;
            mg_add_conn(lc->mgr, nc);
            mg_call(nc, NULL, MG_EV_ACCEPT, &nc->sa);
        } else {
            DBG(("OOM"));
        }
    }
    if (nc != NULL) {
        mg_recv_common(nc, buf, len);
    } else {
        /* Drop on the floor. */
        MG_FREE(buf);
    }
    mg_if_recved(nc, len);
}